

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O1

CborError cbor_encode_negative_int(CborEncoder *encoder,uint64_t absolute_value)

{
  uint8_t *puVar1;
  ulong uVar2;
  CborError CVar3;
  long lVar4;
  char cVar5;
  byte bVar6;
  void *__src;
  uint8_t *puVar7;
  undefined8 local_20;
  uint8_t auStack_18 [8];
  
  encoder->added = encoder->added + 1;
  __src = (void *)((long)&local_20 + 7);
  uVar2 = absolute_value >> 0x38 | (absolute_value & 0xff000000000000) >> 0x28 |
          (absolute_value & 0xff0000000000) >> 0x18 | (absolute_value & 0xff00000000) >> 8 |
          (absolute_value & 0xff000000) << 8 | (absolute_value & 0xff0000) << 0x18 |
          (absolute_value & 0xff00) << 0x28;
  local_20 = uVar2 | absolute_value << 0x38;
  if (absolute_value < 0x18) {
    local_20._7_1_ = (char)absolute_value;
    local_20 = CONCAT17(local_20._7_1_ + ' ',(int7)uVar2);
  }
  else {
    cVar5 = '\x02';
    if (absolute_value < 0x10000) {
      cVar5 = 0xff < absolute_value;
    }
    bVar6 = (cVar5 + '\x01') - (absolute_value >> 0x20 == 0);
    lVar4 = -1L << (bVar6 & 0x3f);
    __src = (void *)((long)__src + lVar4);
    auStack_18[lVar4 + -1] = bVar6 | 0x38;
  }
  puVar7 = auStack_18 + -(long)__src;
  puVar1 = encoder->end;
  if ((long)puVar1 - (long)((encoder->data).ptr + (long)puVar7) < 0) {
    if (puVar1 != (uint8_t *)0x0) {
      puVar7 = (encoder->data).ptr + ((long)puVar7 - (long)puVar1);
      (encoder->data).ptr = (uint8_t *)0x0;
      encoder->end = (uint8_t *)0x0;
    }
    puVar7 = puVar7 + (long)(encoder->data).ptr;
    CVar3 = CborErrorOutOfMemory;
  }
  else {
    memcpy((encoder->data).ptr,__src,(size_t)puVar7);
    puVar7 = puVar7 + (long)(encoder->data).ptr;
    CVar3 = CborNoError;
  }
  (encoder->data).ptr = puVar7;
  return CVar3;
}

Assistant:

CborError cbor_encode_negative_int(CborEncoder *encoder, uint64_t absolute_value)
{
    return encode_number(encoder, absolute_value, NegativeIntegerType << MajorTypeShift);
}